

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_file_server.cpp
# Opt level: O3

int module_load(Server *server)

{
  key_type *__k;
  _Alloc_hider _Var1;
  size_type sVar2;
  int iVar3;
  _Node *p_Var4;
  DIR *__dirp;
  dirent *pdVar5;
  long *plVar6;
  _List_node_base *p_Var7;
  ostream *poVar8;
  mapped_type *pmVar9;
  undefined8 extraout_RAX;
  _List_node_base *p_Var10;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  todo;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_list;
  value_type item;
  _List_node_base *local_108;
  _List_node_base local_f8;
  string local_e8;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  char *local_78;
  long local_70;
  char local_68 [16];
  Server *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = server;
  puts("Loading module FileServer...");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50.field_2._M_allocated_capacity._0_4_ = 0x74617473;
  local_50.field_2._M_allocated_capacity._4_2_ = 0x6369;
  local_50._M_string_length = 6;
  local_50.field_2._M_local_buf[6] = '\0';
  local_90._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_90;
  local_90._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node._M_size = 0;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_a8._M_impl._M_node.super__List_node_base._M_prev =
       local_a8._M_impl._M_node.super__List_node_base._M_next;
  local_90._M_impl._M_node.super__List_node_base._M_prev =
       local_90._M_impl._M_node.super__List_node_base._M_next;
  p_Var4 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
           _M_create_node<std::__cxx11::string_const&>
                     ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                      local_a8._M_impl._M_node.super__List_node_base._M_next,&local_50);
  std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
  local_a8._M_impl._M_node._M_size = local_a8._M_impl._M_node._M_size + 1;
  if (local_a8._M_impl._M_node._M_size != 0) {
    do {
      local_78 = local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,
                 local_a8._M_impl._M_node.super__List_node_base._M_prev[1]._M_next,
                 (long)&(local_a8._M_impl._M_node.super__List_node_base._M_prev[1]._M_next)->_M_next
                 + (long)&(local_a8._M_impl._M_node.super__List_node_base._M_prev[1]._M_prev)->
                          _M_next);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_a8,(iterator)local_a8._M_impl._M_node.super__List_node_base._M_prev);
      __dirp = opendir(local_78);
      if (__dirp != (DIR *)0x0) {
        while (pdVar5 = readdir(__dirp), sVar2 = local_e8._M_string_length, pdVar5 != (dirent *)0x0)
        {
          strlen(pdVar5->d_name);
          std::__cxx11::string::_M_replace((ulong)&local_e8,0,(char *)sVar2,(ulong)pdVar5->d_name);
          iVar3 = std::__cxx11::string::compare((char *)&local_e8);
          if (((iVar3 != 0) &&
              (iVar3 = std::__cxx11::string::compare((char *)&local_e8), iVar3 != 0)) &&
             (*local_e8._M_dataplus._M_p != '.')) {
            if (pdVar5->d_type == '\x04') {
              local_c8[0] = local_b8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_c8,local_78,local_78 + local_70);
              std::__cxx11::string::append((char *)local_c8);
              plVar6 = (long *)std::__cxx11::string::_M_append
                                         ((char *)local_c8,(ulong)local_e8._M_dataplus._M_p);
              local_108 = &local_f8;
              p_Var7 = (_List_node_base *)(plVar6 + 2);
              if ((_List_node_base *)*plVar6 == p_Var7) {
                local_f8._M_next = p_Var7->_M_next;
                local_f8._M_prev = (_List_node_base *)plVar6[3];
              }
              else {
                local_f8._M_next = p_Var7->_M_next;
                local_108 = (_List_node_base *)*plVar6;
              }
              p_Var10 = (_List_node_base *)plVar6[1];
              *plVar6 = (long)p_Var7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              p_Var7 = (_List_node_base *)operator_new(0x30);
              p_Var7[1]._M_next = p_Var7 + 2;
              if (local_108 == &local_f8) {
                p_Var7[2]._M_next = local_f8._M_next;
                p_Var7[2]._M_prev = local_f8._M_prev;
              }
              else {
                p_Var7[1]._M_next = local_108;
                p_Var7[2]._M_next = local_f8._M_next;
              }
              p_Var7[1]._M_prev = p_Var10;
              local_f8._M_next = (_List_node_base *)((ulong)local_f8._M_next & 0xffffffffffffff00);
              std::__detail::_List_node_base::_M_hook(p_Var7);
              local_a8._M_impl._M_node._M_size = local_a8._M_impl._M_node._M_size + 1;
            }
            else {
              if (pdVar5->d_type != '\b') {
                module_load_cold_1();
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p);
                }
                std::__cxx11::
                _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_clear(&local_a8);
                std::__cxx11::
                _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_clear(&local_90);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p);
                }
                _Unwind_Resume(extraout_RAX);
              }
              local_c8[0] = local_b8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_c8,local_78,local_78 + local_70);
              std::__cxx11::string::append((char *)local_c8);
              plVar6 = (long *)std::__cxx11::string::_M_append
                                         ((char *)local_c8,(ulong)local_e8._M_dataplus._M_p);
              local_108 = &local_f8;
              p_Var7 = (_List_node_base *)(plVar6 + 2);
              if ((_List_node_base *)*plVar6 == p_Var7) {
                local_f8._M_next = p_Var7->_M_next;
                local_f8._M_prev = (_List_node_base *)plVar6[3];
              }
              else {
                local_f8._M_next = p_Var7->_M_next;
                local_108 = (_List_node_base *)*plVar6;
              }
              p_Var10 = (_List_node_base *)plVar6[1];
              *plVar6 = (long)p_Var7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              p_Var7 = (_List_node_base *)operator_new(0x30);
              p_Var7[1]._M_next = p_Var7 + 2;
              if (local_108 == &local_f8) {
                p_Var7[2]._M_next = local_f8._M_next;
                p_Var7[2]._M_prev = local_f8._M_prev;
              }
              else {
                p_Var7[1]._M_next = local_108;
                p_Var7[2]._M_next = local_f8._M_next;
              }
              p_Var7[1]._M_prev = p_Var10;
              local_f8._M_next = (_List_node_base *)((ulong)local_f8._M_next & 0xffffffffffffff00);
              std::__detail::_List_node_base::_M_hook(p_Var7);
              local_90._M_impl._M_node._M_size = local_90._M_impl._M_node._M_size + 1;
            }
            if (local_c8[0] != local_b8) {
              operator_delete(local_c8[0]);
            }
          }
        }
        closedir(__dirp);
      }
      if (local_78 != local_68) {
        operator_delete(local_78);
      }
    } while (local_a8._M_impl._M_node._M_size != 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_90._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_90) {
    p_Var7 = local_90._M_impl._M_node.super__List_node_base._M_next;
    do {
      __k = (key_type *)(p_Var7 + 1);
      p_Var10 = p_Var7[1]._M_prev;
      if (p_Var10 < (_List_node_base *)0x7) {
LAB_00103b02:
        if ((_List_node_base *)0x5 < p_Var10) {
          std::__cxx11::string::substr((ulong)&local_e8,(ulong)__k);
          iVar3 = std::__cxx11::string::compare((char *)&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          if (iVar3 == 0) {
            load_file(&local_e8);
            sVar2 = local_e8._M_string_length;
            _Var1._M_p = local_e8._M_dataplus._M_p;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)p_Var7[1]._M_next,
                                (long)p_Var7[1]._M_prev);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[](&filename_to_buffer_abi_cxx11_,__k);
            (pmVar9->
            super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).super__Head_base<0UL,_const_char_*,_false>._M_head_impl = (char *)sVar2;
            (pmVar9->
            super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).
            super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super__Head_base<1UL,_long,_false>._M_head_impl = (long)_Var1._M_p;
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar9,0,
                       (char *)(pmVar9->
                               super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ).
                               super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               .
                               super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               .
                               super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                               ._M_head_impl._M_string_length,0x10501c);
            goto LAB_00103d3f;
          }
          p_Var10 = p_Var7[1]._M_prev;
        }
        if ((_List_node_base *)0x4 < p_Var10) {
          std::__cxx11::string::substr((ulong)&local_e8,(ulong)__k);
          iVar3 = std::__cxx11::string::compare((char *)&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          if (iVar3 == 0) {
            load_file(&local_e8);
            sVar2 = local_e8._M_string_length;
            _Var1._M_p = local_e8._M_dataplus._M_p;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)p_Var7[1]._M_next,
                                (long)p_Var7[1]._M_prev);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[](&filename_to_buffer_abi_cxx11_,__k);
            (pmVar9->
            super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).super__Head_base<0UL,_const_char_*,_false>._M_head_impl = (char *)sVar2;
            (pmVar9->
            super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).
            super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super__Head_base<1UL,_long,_false>._M_head_impl = (long)_Var1._M_p;
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar9,0,
                       (char *)(pmVar9->
                               super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ).
                               super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               .
                               super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               .
                               super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                               ._M_head_impl._M_string_length,0x105029);
          }
        }
      }
      else {
        std::__cxx11::string::substr((ulong)&local_e8,(ulong)__k);
        iVar3 = std::__cxx11::string::compare((char *)&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        if (iVar3 != 0) {
          p_Var10 = p_Var7[1]._M_prev;
          goto LAB_00103b02;
        }
        load_file(&local_e8);
        sVar2 = local_e8._M_string_length;
        _Var1._M_p = local_e8._M_dataplus._M_p;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)p_Var7[1]._M_next,(long)p_Var7[1]._M_prev)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&filename_to_buffer_abi_cxx11_,__k);
        (pmVar9->
        super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).super__Head_base<0UL,_const_char_*,_false>._M_head_impl = (char *)sVar2;
        (pmVar9->
        super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).
        super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Head_base<1UL,_long,_false>._M_head_impl = (long)_Var1._M_p;
        std::__cxx11::string::_M_replace
                  ((ulong)pmVar9,0,
                   (char *)(pmVar9->
                           super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).
                           super__Tuple_impl<1UL,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .
                           super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .
                           super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                           ._M_head_impl._M_string_length,0x10500d);
      }
LAB_00103d3f:
      p_Var7 = (((_List_impl *)&p_Var7->_M_next)->_M_node).super__List_node_base._M_next;
    } while (p_Var7 != (_List_node_base *)&local_90);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_90);
  local_e8._M_dataplus._M_p = (pointer)http_request_handler;
  std::vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>::insert
            ((vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_> *)
             local_58,(const_iterator)*(_func_HTTPResponse_ptr_Client_ptr ***)local_58,
             (value_type *)&local_e8);
  puts("Loaded module FileServer");
  return 0;
}

Assistant:

int module_load(Server *server) {
    printf("Loading module FileServer...\n");
    load_file_into_mem();
    Server::insert_to_front_of_hook(server->http_request_hook, &http_request_handler);
    printf("Loaded module FileServer\n");
    return 0;
}